

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode operate(GlobalConfig *config,int argc,char **argv)

{
  int iVar1;
  ParameterError PVar2;
  CURLcode CVar3;
  OperationConfig *pOVar4;
  size_t i;
  
  setlocale(6,"");
  if (argc == 1) {
    parseconfig((char *)0x0,config);
  }
  else {
    iVar1 = curl_strequal(argv[1],"-q");
    if (((iVar1 != 0) || (iVar1 = curl_strequal(argv[1],"--disable"), iVar1 != 0)) ||
       (parseconfig((char *)0x0,config), 1 < argc)) goto LAB_0011360e;
  }
  if (config->first->url_list == (getout *)0x0) {
    helpf(config->errors,(char *)0x0);
    return CURLE_FAILED_INIT;
  }
LAB_0011360e:
  PVar2 = parse_args(config,argc,argv);
  switch(PVar2) {
  case PARAM_OK:
    if ((config->libcurl != (char *)0x0) && (CVar3 = easysrc_init(), CVar3 != CURLE_OK)) {
      helpf(config->errors,"out of memory\n");
      return CVar3;
    }
    pOVar4 = config->first;
    if (pOVar4 == (OperationConfig *)0x0) {
      config->current = (OperationConfig *)0x0;
      goto LAB_001136dc;
    }
    i = 0;
    do {
      CVar3 = get_args(pOVar4,i);
      if (CVar3 != CURLE_OK) break;
      i = i + 1;
      pOVar4 = pOVar4->next;
    } while (pOVar4 != (OperationConfig *)0x0);
    config->current = config->first;
    do {
      if (CVar3 != CURLE_OK) {
LAB_00113717:
        if (config->libcurl != (char *)0x0) {
          easysrc_cleanup();
          dumpeasysrc(config);
          return CVar3;
        }
        return CVar3;
      }
LAB_001136dc:
      if (config->current == (OperationConfig *)0x0) {
        CVar3 = CURLE_OK;
        goto LAB_00113717;
      }
      CVar3 = operate_do(config,config->current);
      pOVar4 = config->current->next;
      config->current = pOVar4;
      if ((pOVar4 != (OperationConfig *)0x0) && (pOVar4->easy != (CURL *)0x0)) {
        curl_easy_reset();
      }
    } while( true );
  default:
    return CURLE_FAILED_INIT;
  case PARAM_HELP_REQUESTED:
    tool_help();
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines(config->easy);
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  return CURLE_OK;
}

Assistant:

CURLcode operate(struct GlobalConfig *config, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;

  /* Setup proper locale from environment */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (!curl_strequal(argv[1], "-q") &&
      !curl_strequal(argv[1], "--disable"))) {
    parseconfig(NULL, config); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!config->first->url_list)) {
      helpf(config->errors, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(config, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help();
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines(config->easy);
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
#ifndef CURL_DISABLE_LIBCURL_OPTION
      if(config->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }
#endif

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = config->first;

        /* Get the required arguments for each operation */
        while(!result && operation) {
          result = get_args(operation, count++);

          operation = operation->next;
        }

        /* Set the current operation pointer */
        config->current = config->first;

        /* Perform each operation */
        while(!result && config->current) {
          result = operate_do(config, config->current);

          config->current = config->current->next;

          if(config->current && config->current->easy)
            curl_easy_reset(config->current->easy);
        }

#ifndef CURL_DISABLE_LIBCURL_OPTION
        if(config->libcurl) {
          /* Cleanup the libcurl source output */
          easysrc_cleanup();

          /* Dump the libcurl code if previously enabled */
          dumpeasysrc(config);
        }
#endif
      }
      else
        helpf(config->errors, "out of memory\n");
    }
  }

  return result;
}